

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

void __thiscall
Enterprise::ConcreteMachine<false,_false>::ConcreteMachine
          (ConcreteMachine<false,_false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  uint8_t uVar1;
  bool bVar2;
  iterator pvVar3;
  undefined4 *puVar4;
  const_iterator pNVar5;
  pointer __dest;
  pointer ppVar6;
  uchar *puVar7;
  unsigned_long *puVar8;
  pointer pvVar9;
  reference pvVar10;
  pointer __dest_00;
  ulong uVar11;
  bool local_971;
  bool *local_8b8;
  size_type local_888;
  size_type local_880;
  _Self local_878;
  key_type local_86c;
  _Self local_868;
  iterator exdos;
  size_type local_858;
  size_type local_850;
  _Self local_848;
  key_type local_83c;
  _Self local_838;
  iterator epdos;
  size_type local_828;
  unsigned_long local_820;
  size_type local_818;
  unsigned_long local_810;
  _Self local_808;
  _Self local_800;
  key_type local_7f4;
  _Self local_7f0;
  iterator basic2;
  _Self local_7e0;
  iterator basic1;
  size_type local_7d0;
  _Self local_7c8;
  _Self local_7c0;
  iterator basic;
  Name rom_name_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  undefined4 local_798;
  undefined4 local_794;
  initializer_list<ROM::Name> local_790;
  initializer_list<ROM::Name> *local_780;
  initializer_list<ROM::Name> *__range2_1;
  bool has_basic;
  size_type sStack_770;
  size_type local_768;
  _Self local_760;
  _Self local_758;
  iterator exos;
  Name rom_name;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 local_730;
  undefined4 local_72c;
  initializer_list<ROM::Name> local_728;
  initializer_list<ROM::Name> *local_718;
  initializer_list<ROM::Name> *__range2;
  undefined1 local_708 [8];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_6b0;
  Request local_688;
  Request local_660;
  Request local_638;
  Request local_610;
  Request local_5e8;
  Request local_5c0;
  Request local_598;
  Request local_570;
  Request local_548;
  Request local_520;
  Request local_4f8;
  Request local_4d0;
  Request local_4a8;
  Request local_480;
  Request local_458;
  Request local_430;
  Request local_408;
  Request local_3e0;
  Request local_3b8;
  Request local_390;
  Request local_368;
  Request local_340;
  Request local_318;
  Request local_2f0;
  Request local_2c8;
  Request local_2a0;
  Request local_278;
  Request local_250;
  Request local_228;
  Request local_200;
  Request local_1d8;
  Request local_1b0;
  Request local_188;
  Request local_160;
  Request local_138;
  Request local_110;
  Request local_e8;
  Request local_c0;
  undefined1 local_98 [8];
  Request request;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<false,_false> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  Activity::Source::Source(&this->super_Source);
  Configurable::Device::Device(&this->super_Device);
  Enterprise::Machine::Machine(&this->super_Machine);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  Utility::TypeRecipient<Enterprise::CharacterMapper>::TypeRecipient<>
            (&this->super_TypeRecipient<Enterprise::CharacterMapper>);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00ca0150;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca01f0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca0210;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca0230;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca0248;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca0278;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca02b8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca02d0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca0308;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_00ca0350;
  memset(&this->ram_,0,0x40000);
  uVar1 = min_ram_slot(this,(Target *)rom_fetcher_local);
  this->min_ram_slot_ = uVar1;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->pages_[0] = 0x80;
  this->pages_[1] = 0x80;
  this->pages_[2] = 0x80;
  this->pages_[3] = 0x80;
  this->wait_mode_ = OnAllAccesses;
  local_8b8 = this->is_video_;
  do {
    *local_8b8 = false;
    local_8b8 = local_8b8 + 1;
  } while (local_8b8 != (bool *)&this->field_0x60174);
  Enterprise::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  this->active_key_line_ = '\0';
  this->should_skip_splash_screen_ = false;
  this->typer_delay_ = 0x1e;
  this->interrupt_mask_ = '\0';
  this->interrupt_state_ = '\0';
  CPU::Z80::Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false>::Processor
            (&this->z80_,this);
  pvVar3 = std::array<unsigned_char,_262144UL>::end(&this->ram_);
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pvVar3 + -0x10000);
  JustInTimeActor<Enterprise::Nick,HalfCycles,40434603,11360000>::JustInTimeActor<unsigned_char*>
            ((JustInTimeActor<Enterprise::Nick,HalfCycles,40434603,11360000> *)&this->nick_,
             (uchar **)
             &request.node.children.
              super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this->previous_nick_interrupt_line_ = false;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  Dave::Audio::Audio(&this->dave_audio_,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass
            (&this->speaker_,&this->dave_audio_);
  HalfCycles::HalfCycles(&this->time_since_audio_update_);
  HalfCycles::HalfCycles(&this->dave_delay_,2);
  JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::JustInTimeActor<>
            (&this->dave_timer_);
  EXDos::EXDos(&this->exdos_);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,4000000.0);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::
  set_input_rate(&(this->speaker_).
                  super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>,
                 500000.0);
  ROM::Request::Request((Request *)local_98);
  switch(*(undefined4 *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc)) {
  case 0:
    ROM::Request::Request(&local_e8,EnterpriseEXOS10,false);
    ROM::Request::operator&&(&local_c0,(Request *)local_98,&local_e8);
    ROM::Request::operator=((Request *)local_98,&local_c0);
    ROM::Request::~Request(&local_c0);
    ROM::Request::~Request(&local_e8);
    break;
  case 1:
    ROM::Request::Request(&local_138,EnterpriseEXOS20,false);
    ROM::Request::operator&&(&local_110,(Request *)local_98,&local_138);
    ROM::Request::operator=((Request *)local_98,&local_110);
    ROM::Request::~Request(&local_110);
    ROM::Request::~Request(&local_138);
    break;
  case 2:
    ROM::Request::Request(&local_188,EnterpriseEXOS21,false);
    ROM::Request::operator&&(&local_160,(Request *)local_98,&local_188);
    ROM::Request::operator=((Request *)local_98,&local_160);
    ROM::Request::~Request(&local_160);
    ROM::Request::~Request(&local_188);
    break;
  case 3:
    ROM::Request::Request(&local_1d8,EnterpriseEXOS23,false);
    ROM::Request::operator&&(&local_1b0,(Request *)local_98,&local_1d8);
    ROM::Request::operator=((Request *)local_98,&local_1b0);
    ROM::Request::~Request(&local_1b0);
    ROM::Request::~Request(&local_1d8);
    break;
  case 4:
    ROM::Request::Request(&local_2a0,EnterpriseEXOS10,false);
    ROM::Request::Request(&local_2c8,EnterpriseEXOS20,false);
    ROM::Request::operator||(&local_278,&local_2a0,&local_2c8);
    ROM::Request::Request(&local_2f0,EnterpriseEXOS21,false);
    ROM::Request::operator||(&local_250,&local_278,&local_2f0);
    ROM::Request::Request(&local_318,EnterpriseEXOS23,false);
    ROM::Request::operator||(&local_228,&local_250,&local_318);
    ROM::Request::operator&&(&local_200,(Request *)local_98,&local_228);
    ROM::Request::operator=((Request *)local_98,&local_200);
    ROM::Request::~Request(&local_200);
    ROM::Request::~Request(&local_228);
    ROM::Request::~Request(&local_318);
    ROM::Request::~Request(&local_250);
    ROM::Request::~Request(&local_2f0);
    ROM::Request::~Request(&local_278);
    ROM::Request::~Request(&local_2c8);
    ROM::Request::~Request(&local_2a0);
  }
  switch(*(undefined4 *)&rom_fetcher_local[4].super__Function_base._M_manager) {
  case 0:
    ROM::Request::Request(&local_390,EnterpriseBASIC10,false);
    ROM::Request::Request(&local_3e0,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_408,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_3b8,&local_3e0,&local_408);
    ROM::Request::operator||(&local_368,&local_390,&local_3b8);
    ROM::Request::operator&&(&local_340,(Request *)local_98,&local_368);
    ROM::Request::operator=((Request *)local_98,&local_340);
    ROM::Request::~Request(&local_340);
    ROM::Request::~Request(&local_368);
    ROM::Request::~Request(&local_3b8);
    ROM::Request::~Request(&local_408);
    ROM::Request::~Request(&local_3e0);
    ROM::Request::~Request(&local_390);
    break;
  case 1:
    ROM::Request::Request(&local_480,EnterpriseBASIC11,false);
    ROM::Request::Request(&local_4a8,EnterpriseBASIC11Suffixed,false);
    ROM::Request::operator||(&local_458,&local_480,&local_4a8);
    ROM::Request::operator&&(&local_430,(Request *)local_98,&local_458);
    ROM::Request::operator=((Request *)local_98,&local_430);
    ROM::Request::~Request(&local_430);
    ROM::Request::~Request(&local_458);
    ROM::Request::~Request(&local_4a8);
    ROM::Request::~Request(&local_480);
    break;
  case 2:
    ROM::Request::Request(&local_4f8,EnterpriseBASIC21,false);
    ROM::Request::operator&&(&local_4d0,(Request *)local_98,&local_4f8);
    ROM::Request::operator=((Request *)local_98,&local_4d0);
    ROM::Request::~Request(&local_4d0);
    ROM::Request::~Request(&local_4f8);
    break;
  case 3:
    ROM::Request::Request(&local_5c0,EnterpriseBASIC10,false);
    ROM::Request::Request(&local_610,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_638,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_5e8,&local_610,&local_638);
    ROM::Request::operator||(&local_598,&local_5c0,&local_5e8);
    ROM::Request::Request(&local_660,EnterpriseBASIC11,false);
    ROM::Request::operator||(&local_570,&local_598,&local_660);
    ROM::Request::Request(&local_688,EnterpriseBASIC21,false);
    ROM::Request::operator||(&local_548,&local_570,&local_688);
    ROM::Request::operator&&(&local_520,(Request *)local_98,&local_548);
    ROM::Request::operator=((Request *)local_98,&local_520);
    ROM::Request::~Request(&local_520);
    ROM::Request::~Request(&local_548);
    ROM::Request::~Request(&local_688);
    ROM::Request::~Request(&local_570);
    ROM::Request::~Request(&local_660);
    ROM::Request::~Request(&local_598);
    ROM::Request::~Request(&local_5e8);
    ROM::Request::~Request(&local_638);
    ROM::Request::~Request(&local_610);
    ROM::Request::~Request(&local_5c0);
  }
  if (*(int *)((long)&rom_fetcher_local[4].super__Function_base._M_manager + 4) == 0) {
    ROM::Request::Request
              ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,EnterpriseEXDOS,
               false);
    ROM::Request::operator&&
              (&local_6b0,(Request *)local_98,
               (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ROM::Request::operator=((Request *)local_98,&local_6b0);
    ROM::Request::~Request(&local_6b0);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_708,local_20,(Request *)local_98);
  bVar2 = ROM::Request::validate((Request *)local_98,(Map *)local_708);
  if (!bVar2) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&ROMMachine::Error::typeinfo,0);
  }
  __range2._7_1_ = 0xff;
  std::array<unsigned_char,_65536UL>::fill
            (&this->exos_,(value_type_conflict3 *)((long)&__range2 + 7));
  __begin2._0_4_ = 0x2f;
  __begin2._4_4_ = 0x30;
  local_730 = 0x31;
  local_72c = 0x32;
  local_728._M_array = (iterator)&__begin2;
  local_728._M_len = 4;
  local_718 = &local_728;
  __end2 = std::initializer_list<ROM::Name>::begin(local_718);
  pNVar5 = std::initializer_list<ROM::Name>::end(local_718);
  for (; __end2 != pNVar5; __end2 = __end2 + 1) {
    exos._M_node._4_4_ = *__end2;
    local_758._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_708,(key_type *)((long)&exos._M_node + 4));
    local_760._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_708);
    bVar2 = std::operator!=(&local_758,&local_760);
    if (bVar2) {
      __dest = std::array<unsigned_char,_65536UL>::data(&this->exos_);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_758);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second);
      local_768 = std::array<unsigned_char,_65536UL>::size(&this->exos_);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_758);
      sStack_770 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&ppVar6->second)
      ;
      puVar8 = std::min<unsigned_long>(&local_768,&stack0xfffffffffffff890);
      memcpy(__dest,puVar7,*puVar8);
      break;
    }
  }
  __range2_1._7_1_ = 0xff;
  std::array<unsigned_char,_16384UL>::fill
            (&this->basic_,(value_type_conflict3 *)((long)&__range2_1 + 7));
  __range2_1._6_1_ = 0;
  __begin2_1._0_4_ = 0x33;
  __begin2_1._4_4_ = 0x36;
  local_798 = 0x37;
  local_794 = 0x38;
  local_790._M_array = (iterator)&__begin2_1;
  local_790._M_len = 4;
  local_780 = &local_790;
  __end2_1 = std::initializer_list<ROM::Name>::begin(local_780);
  pNVar5 = std::initializer_list<ROM::Name>::end(local_780);
  do {
    if (__end2_1 == pNVar5) {
LAB_0072c7a6:
      if ((__range2_1._6_1_ & 1) == 0) {
        basic2._M_node._4_4_ = 0x34;
        local_7e0._M_node =
             (_Base_ptr)
             std::
             map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_708,(key_type *)((long)&basic2._M_node + 4));
        local_7f4 = EnterpriseBASIC10Part2;
        local_7f0._M_node =
             (_Base_ptr)
             std::
             map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_708,&local_7f4);
        local_800._M_node =
             (_Base_ptr)
             std::
             map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)local_708);
        bVar2 = std::operator!=(&local_7e0,&local_800);
        local_971 = false;
        if (bVar2) {
          local_808._M_node =
               (_Base_ptr)
               std::
               map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)local_708);
          local_971 = std::operator!=(&local_7f0,&local_808);
        }
        if (local_971 != false) {
          pvVar10 = std::array<unsigned_char,_16384UL>::operator[](&this->basic_,0);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator->(&local_7e0);
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second)
          ;
          local_810 = 0x2000;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator->(&local_7e0);
          local_818 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&ppVar6->second);
          puVar8 = std::min<unsigned_long>(&local_810,&local_818);
          memcpy(pvVar10,puVar7,*puVar8);
          pvVar10 = std::array<unsigned_char,_16384UL>::operator[](&this->basic_,0x2000);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator->(&local_7f0);
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second)
          ;
          local_820 = 0x2000;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator->(&local_7f0);
          local_828 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&ppVar6->second);
          puVar8 = std::min<unsigned_long>(&local_820,&local_828);
          memcpy(pvVar10,puVar7,*puVar8);
        }
      }
      epdos._M_node._7_1_ = 0xff;
      std::array<unsigned_char,_32768UL>::fill
                (&this->epdos_rom_,(value_type_conflict3 *)((long)&epdos._M_node + 7));
      local_83c = EnterpriseEPDOS;
      local_838._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_708,&local_83c);
      local_848._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_708);
      bVar2 = std::operator!=(&local_838,&local_848);
      if (bVar2) {
        __dest_00 = std::array<unsigned_char,_32768UL>::data(&this->epdos_rom_);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator->(&local_838);
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second);
        local_850 = std::array<unsigned_char,_32768UL>::size(&this->epdos_rom_);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator->(&local_838);
        local_858 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&ppVar6->second);
        puVar8 = std::min<unsigned_long>(&local_850,&local_858);
        memcpy(__dest_00,puVar7,*puVar8);
      }
      exdos._M_node._7_1_ = 0xff;
      std::array<unsigned_char,_16384UL>::fill
                (&this->exdos_rom_,(value_type_conflict3 *)((long)&exdos._M_node + 7));
      local_86c = EnterpriseEXDOS;
      local_868._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_708,&local_86c);
      local_878._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_708);
      bVar2 = std::operator!=(&local_868,&local_878);
      if (bVar2) {
        pvVar9 = std::array<unsigned_char,_16384UL>::data(&this->exdos_rom_);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator->(&local_868);
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second);
        local_880 = std::array<unsigned_char,_16384UL>::size(&this->exdos_rom_);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator->(&local_868);
        local_888 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&ppVar6->second);
        puVar8 = std::min<unsigned_long>(&local_880,&local_888);
        memcpy(pvVar9,puVar7,*puVar8);
      }
      clear_all_keys(this);
      ConcreteMachine<false,false>::page<0ul>((ConcreteMachine<false,false> *)this,'\0');
      ConcreteMachine<false,false>::page<1ul>((ConcreteMachine<false,false> *)this,'\0');
      ConcreteMachine<false,false>::page<2ul>((ConcreteMachine<false,false> *)this,'\0');
      ConcreteMachine<false,false>::page<3ul>((ConcreteMachine<false,false> *)this,'\0');
      insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        type_string(this,(string *)(rom_fetcher_local + 5));
      }
      bVar2 = Analyser::Static::Media::empty((Media *)&rom_fetcher_local->_M_invoker);
      if (!bVar2) {
        bVar2 = Analyser::Static::Media::empty((Media *)&rom_fetcher_local->_M_invoker);
        this->should_skip_splash_screen_ = (bool)((bVar2 ^ 0xffU) & 1);
        this->typer_delay_ = 2;
      }
      std::
      map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_708);
      ROM::Request::~Request((Request *)local_98);
      return;
    }
    basic._M_node._4_4_ = *__end2_1;
    local_7c0._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_708,(key_type *)((long)&basic._M_node + 4));
    local_7c8._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_708);
    bVar2 = std::operator!=(&local_7c0,&local_7c8);
    if (bVar2) {
      pvVar9 = std::array<unsigned_char,_16384UL>::data(&this->basic_);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_7c0);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar6->second);
      local_7d0 = std::array<unsigned_char,_16384UL>::size(&this->basic_);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_7c0);
      basic1._M_node =
           (_Base_ptr)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&ppVar6->second);
      puVar8 = std::min<unsigned_long>(&local_7d0,(unsigned_long *)&basic1);
      memcpy(pvVar9,puVar7,*puVar8);
      __range2_1._6_1_ = 1;
      goto LAB_0072c7a6;
    }
    __end2_1 = __end2_1 + 1;
  } while( true );
}

Assistant:

ConcreteMachine(const Analyser::Static::Enterprise::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			min_ram_slot_(min_ram_slot(target)),
			z80_(*this),
			nick_(ram_.end() - 65536),
			dave_audio_(audio_queue_),
			speaker_(dave_audio_) {

			// Request a clock of 4Mhz; this'll be mapped upwards for Nick and downwards for Dave elsewhere.
			set_clock_rate(clock_rate);
			speaker_.set_input_rate(float(clock_rate) / float(dave_divider));

			ROM::Request request;
			using Target = Analyser::Static::Enterprise::Target;

			// Pick one or more EXOS ROMs.
			switch(target.exos_version) {
				case Target::EXOSVersion::v10:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS10);	break;
				case Target::EXOSVersion::v20:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS20);	break;
				case Target::EXOSVersion::v21:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS21);	break;
				case Target::EXOSVersion::v23:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS23);	break;
				case Target::EXOSVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseEXOS10) || ROM::Request(ROM::Name::EnterpriseEXOS20) ||
							ROM::Request(ROM::Name::EnterpriseEXOS21) || ROM::Request(ROM::Name::EnterpriseEXOS23)
						);
				break;

				default: break;
			}

			// Similarly pick one or more BASIC ROMs.
			switch(target.basic_version) {
				case Target::BASICVersion::v10:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC10) ||
						(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2))
					);
				break;
				case Target::BASICVersion::v11:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC11) ||
						ROM::Request(ROM::Name::EnterpriseBASIC11Suffixed)
					);
				break;
				case Target::BASICVersion::v21:
					request = request && ROM::Request(ROM::Name::EnterpriseBASIC21);
				break;
				case Target::BASICVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseBASIC10) ||
							(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2)) ||
							ROM::Request(ROM::Name::EnterpriseBASIC11) ||
							ROM::Request(ROM::Name::EnterpriseBASIC21)
						);
				break;

				default: break;
			}

			// Possibly add in a DOS.
			switch(target.dos) {
				case Target::DOS::EXDOS:			request = request && ROM::Request(ROM::Name::EnterpriseEXDOS);	break;
				default: break;
			}

			// Get and validate ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Extract the appropriate EXOS ROM.
			exos_.fill(0xff);
			for(const auto rom_name: { ROM::Name::EnterpriseEXOS10, ROM::Name::EnterpriseEXOS20, ROM::Name::EnterpriseEXOS21, ROM::Name::EnterpriseEXOS23 }) {
				const auto exos = roms.find(rom_name);
				if(exos != roms.end()) {
					memcpy(exos_.data(), exos->second.data(), std::min(exos_.size(), exos->second.size()));
					break;
				}
			}

			// Extract the appropriate BASIC ROM[s] (if any).
			basic_.fill(0xff);
			bool has_basic = false;
			for(const auto rom_name: { ROM::Name::EnterpriseBASIC10, ROM::Name::EnterpriseBASIC11, ROM::Name::EnterpriseBASIC11Suffixed, ROM::Name::EnterpriseBASIC21 }) {
				const auto basic = roms.find(rom_name);
				if(basic != roms.end()) {
					memcpy(basic_.data(), basic->second.data(), std::min(basic_.size(), basic->second.size()));
					has_basic = true;
					break;
				}
			}
			if(!has_basic) {
				const auto basic1 = roms.find(ROM::Name::EnterpriseBASIC10Part1);
				const auto basic2 = roms.find(ROM::Name::EnterpriseBASIC10Part2);
				if(basic1 != roms.end() && basic2 != roms.end()) {
					memcpy(&basic_[0x0000], basic1->second.data(), std::min(size_t(8192), basic1->second.size()));
					memcpy(&basic_[0x2000], basic2->second.data(), std::min(size_t(8192), basic2->second.size()));
				}
			}

			// Extract the appropriate DOS ROMs.
			epdos_rom_.fill(0xff);
			const auto epdos = roms.find(ROM::Name::EnterpriseEPDOS);
			if(epdos != roms.end()) {
				memcpy(epdos_rom_.data(), epdos->second.data(), std::min(epdos_rom_.size(), epdos->second.size()));
			}
			exdos_rom_.fill(0xff);
			const auto exdos = roms.find(ROM::Name::EnterpriseEXDOS);
			if(exdos != roms.end()) {
				memcpy(exdos_rom_.data(), exdos->second.data(), std::min(exdos_rom_.size(), exdos->second.size()));
			}

			// Seed key state.
			clear_all_keys();

			// Take a reasonable guess at the initial memory configuration:
			// put EXOS into the first bank since this is a Z80 and therefore
			// starts from address 0; the third instruction in EXOS is a jump
			// to $c02e so it's reasonable to assume EXOS is in the highest bank
			// too, and it appears to act correctly if it's the first 16kb that's
			// in the highest bank. From there I guess: all banks are initialised
			// to 0.
			page<0>(0x00);
			page<1>(0x00);
			page<2>(0x00);
			page<3>(0x00);

			// Pass on any media.
			insert_media(target.media);
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Ensure the splash screen is automatically skipped if any media has been provided.
			if(!target.media.empty()) {
				should_skip_splash_screen_ = !target.media.empty();
				typer_delay_ = 2;
			}
		}